

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi_uc sVar2;
  stbi__context *s;
  stbi__context *psVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  stbi_uc sVar8;
  int iVar9;
  stbi__uint32 sVar10;
  stbi__uint32 sVar11;
  int iVar12;
  int depth;
  int iVar13;
  size_t __size;
  char *pcVar14;
  stbi_uc *psVar15;
  stbi_uc *psVar16;
  uint uVar17;
  long lVar18;
  stbi_uc *psVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ushort uVar23;
  uint uVar24;
  uint y;
  int out_n;
  uint uVar25;
  uint uVar26;
  long lVar27;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  uint color;
  size_t sVar31;
  long in_FS_OFFSET;
  bool bVar32;
  stbi_uc tc [3];
  stbi__uint16 tc16 [3];
  stbi__uint32 local_47c;
  stbi__uint32 raw_len;
  ulong local_450;
  ulong local_448;
  stbi_uc *local_440;
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->out = (stbi_uc *)0x0;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  iVar9 = stbi__check_png_header(s);
  if (iVar9 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar32 = true;
  bVar6 = 0;
  color = 0;
  bVar4 = false;
  uVar25 = 0;
  uVar29 = 0;
  bVar28 = 0;
  uVar30 = 0;
  bVar5 = false;
LAB_0015d8b9:
  sVar10 = stbi__get32be(s);
  sVar31 = (size_t)sVar10;
  sVar11 = stbi__get32be(s);
  if (sVar11 == 0x43674249) {
    bVar4 = true;
LAB_0015da27:
    stbi__skip(s,sVar10);
  }
  else if (sVar11 == 0x49444154) {
    if (bVar32) goto LAB_0015dd03;
    if ((bVar28 != 0) && (uVar25 == 0)) {
      pcVar14 = "no PLTE";
      goto LAB_0015dd0a;
    }
    if (scan == 2) {
      s->img_n = (uint)bVar28;
      return 1;
    }
    uVar26 = sVar10 + uVar30;
    if ((int)uVar26 < (int)uVar30) {
      return 0;
    }
    if (uVar29 < uVar26) {
      if (sVar10 < 0x1001) {
        sVar31 = 0x1000;
      }
      if (uVar29 != 0) {
        sVar31 = (ulong)uVar29;
      }
      do {
        __size = sVar31;
        uVar29 = (uint)__size;
        sVar31 = (ulong)(uVar29 * 2);
      } while (uVar29 < uVar26);
      psVar15 = (stbi_uc *)realloc(*ppsVar1,__size);
      if (psVar15 == (stbi_uc *)0x0) goto LAB_0015e3b7;
      *ppsVar1 = psVar15;
    }
    else {
      psVar15 = *ppsVar1;
    }
    iVar9 = stbi__getn(s,psVar15 + uVar30,sVar10);
    if (iVar9 == 0) {
      pcVar14 = "outofdata";
      goto LAB_0015dd0a;
    }
    bVar32 = false;
    uVar30 = uVar26;
  }
  else {
    if (sVar11 != 0x49484452) {
      if (sVar11 == 0x504c5445) {
        if (!bVar32) {
          if ((sVar10 < 0x301) && (uVar25 = (sVar10 & 0xffff) / 3, uVar25 * 3 == sVar10)) {
            for (uVar20 = 0; uVar25 != uVar20; uVar20 = uVar20 + 1) {
              sVar8 = stbi__get8(s);
              palette[uVar20 * 4] = sVar8;
              sVar8 = stbi__get8(s);
              palette[uVar20 * 4 + 1] = sVar8;
              sVar8 = stbi__get8(s);
              palette[uVar20 * 4 + 2] = sVar8;
              palette[uVar20 * 4 + 3] = 0xff;
            }
            bVar32 = false;
            goto LAB_0015dcc9;
          }
          pcVar14 = "invalid PLTE";
          goto LAB_0015dd0a;
        }
      }
      else if (sVar11 == 0x74524e53) {
        if (!bVar32) {
          if (*ppsVar1 != (stbi_uc *)0x0) {
            pcVar14 = "tRNS after IDAT";
            goto LAB_0015dd0a;
          }
          if (bVar28 == 0) {
            uVar26 = s->img_n;
            if ((uVar26 & 1) != 0) {
              if (uVar26 * 2 != sVar10) goto LAB_0015dd73;
              if (z->depth == 0x10) {
                for (lVar18 = 0; lVar18 < (int)uVar26; lVar18 = lVar18 + 1) {
                  iVar9 = stbi__get16be(s);
                  tc16[lVar18] = (stbi__uint16)iVar9;
                  uVar26 = s->img_n;
                }
              }
              else {
                for (lVar18 = 0; lVar18 < (int)uVar26; lVar18 = lVar18 + 1) {
                  iVar9 = stbi__get16be(s);
                  tc[lVar18] = ""[z->depth] * (char)iVar9;
                  uVar26 = s->img_n;
                }
              }
              bVar5 = true;
              bVar32 = false;
              bVar28 = 0;
              goto LAB_0015dcc9;
            }
            pcVar14 = "tRNS with alpha";
            goto LAB_0015dd0a;
          }
          if (scan == 2) {
            s->img_n = 4;
            return 1;
          }
          if (uVar25 == 0) {
            pcVar14 = "tRNS before PLTE";
            goto LAB_0015dd0a;
          }
          if (uVar25 < sVar10) {
LAB_0015dd73:
            pcVar14 = "bad tRNS len";
            goto LAB_0015dd0a;
          }
          for (uVar20 = 0; sVar31 != uVar20; uVar20 = uVar20 + 1) {
            sVar8 = stbi__get8(s);
            palette[uVar20 * 4 + 3] = sVar8;
          }
          bVar28 = 4;
          bVar32 = false;
          goto LAB_0015dcc9;
        }
      }
      else if (sVar11 == 0x49454e44) {
        if (!bVar32) {
          if (scan != 0) {
            return 1;
          }
          if (*ppsVar1 != (stbi_uc *)0x0) {
            raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
            psVar15 = (stbi_uc *)
                      stbi_zlib_decode_malloc_guesssize_headerflag
                                ((char *)*ppsVar1,uVar30,raw_len,(int *)&raw_len,(uint)!bVar4);
            z->expanded = psVar15;
            if (psVar15 == (stbi_uc *)0x0) {
              return 0;
            }
            free(z->idata);
            z->idata = (stbi_uc *)0x0;
            iVar9 = s->img_n + 1;
            iVar12 = s->img_n;
            if (bVar5) {
              iVar12 = iVar9;
            }
            out_n = iVar12;
            if (req_comp != 3) {
              out_n = iVar9;
            }
            if (bVar28 != 0) {
              out_n = iVar12;
            }
            if (iVar9 != req_comp) {
              out_n = iVar12;
            }
            s->img_out_n = out_n;
            uVar25 = z->depth;
            local_450 = (ulong)uVar25;
            psVar15 = z->expanded;
            sVar10 = z->s->img_x;
            sVar11 = z->s->img_y;
            if (bVar6 == 0) {
              iVar9 = stbi__create_png_image_raw(z,psVar15,raw_len,out_n,sVar10,sVar11,uVar25,color)
              ;
              if (iVar9 == 0) {
                return 0;
              }
            }
            else {
              iVar9 = out_n << (uVar25 == 0x10);
              local_47c = raw_len;
              psVar16 = (stbi_uc *)stbi__malloc_mad3(sVar10,sVar11,iVar9,0);
              sVar31 = (size_t)iVar9;
              for (uVar20 = (ulong)(uint)(0 << (uVar25 == 0x10)); uVar20 != 7; uVar20 = uVar20 + 1)
              {
                uVar25 = (&DAT_00162e30)[uVar20];
                psVar3 = z->s;
                uVar30 = (&DAT_00162e70)[uVar20];
                uVar21 = ~uVar25 + psVar3->img_x + uVar30;
                uVar17 = uVar21 / uVar30;
                uVar29 = (&DAT_00162e50)[uVar20];
                uVar26 = (&DAT_00162e90)[uVar20];
                uVar24 = ~uVar29 + psVar3->img_y + uVar26;
                y = uVar24 / uVar26;
                if ((uVar30 <= uVar21) && (uVar26 <= uVar24)) {
                  depth = (int)local_450;
                  iVar12 = psVar3->img_n;
                  iVar13 = stbi__create_png_image_raw
                                     (z,psVar15,local_47c,out_n,uVar17,y,depth,color);
                  if (iVar13 == 0) {
                    free(psVar16);
                    return 0;
                  }
                  iVar13 = uVar29 * iVar9;
                  uVar29 = (((int)(uVar17 * depth * iVar12 + 7) >> 3) + 1) * y;
                  local_448 = uVar20;
                  local_440 = psVar15;
                  for (lVar18 = 0; lVar18 < (int)y; lVar18 = lVar18 + 1) {
                    psVar15 = psVar16 + (long)(int)uVar25 * sVar31;
                    for (lVar27 = 0; lVar27 < (int)uVar17; lVar27 = lVar27 + 1) {
                      memcpy(psVar15 + z->s->img_x * iVar13,
                             z->out + (lVar27 + lVar18 * (int)uVar17) * sVar31,sVar31);
                      psVar15 = psVar15 + (long)(int)uVar30 * sVar31;
                    }
                    iVar13 = iVar13 + uVar26 * iVar9;
                  }
                  free(z->out);
                  local_47c = local_47c - uVar29;
                  psVar15 = local_440 + uVar29;
                  uVar20 = local_448;
                }
              }
              z->out = psVar16;
            }
            if (bVar5) {
              psVar15 = z->out;
              iVar9 = z->s->img_y * z->s->img_x;
              if (z->depth == 0x10) {
                if (s->img_out_n == 2) {
                  for (lVar18 = 0; iVar9 != (int)lVar18; lVar18 = lVar18 + 1) {
                    *(ushort *)(psVar15 + lVar18 * 4 + 2) =
                         -(ushort)(*(stbi__uint16 *)(psVar15 + lVar18 * 4) != tc16[0]);
                  }
                }
                else {
                  for (lVar18 = 0; iVar9 != (int)lVar18; lVar18 = lVar18 + 1) {
                    if (((*(stbi__uint16 *)(psVar15 + lVar18 * 8) == tc16[0]) &&
                        (*(stbi__uint16 *)(psVar15 + lVar18 * 8 + 2) == tc16[1])) &&
                       (*(stbi__uint16 *)(psVar15 + lVar18 * 8 + 4) == tc16[2])) {
                      (psVar15 + lVar18 * 8 + 6)[0] = '\0';
                      (psVar15 + lVar18 * 8 + 6)[1] = '\0';
                    }
                  }
                }
              }
              else if (s->img_out_n == 2) {
                for (lVar18 = 0; iVar9 != (int)lVar18; lVar18 = lVar18 + 1) {
                  psVar15[lVar18 * 2 + 1] = -(psVar15[lVar18 * 2] != tc[0]);
                }
              }
              else {
                for (lVar18 = 0; iVar9 != (int)lVar18; lVar18 = lVar18 + 1) {
                  if (((psVar15[lVar18 * 4] == tc[0]) && (psVar15[lVar18 * 4 + 1] == tc[1])) &&
                     (psVar15[lVar18 * 4 + 2] == tc[2])) {
                    psVar15[lVar18 * 4 + 3] = '\0';
                  }
                }
              }
            }
            if (((bVar4) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
              psVar3 = z->s;
              psVar15 = z->out;
              iVar9 = psVar3->img_y * psVar3->img_x;
              if (psVar3->img_out_n == 3) {
                while (bVar32 = iVar9 != 0, iVar9 = iVar9 + -1, bVar32) {
                  sVar8 = *psVar15;
                  *psVar15 = psVar15[2];
                  psVar15[2] = sVar8;
                  psVar15 = psVar15 + 3;
                }
              }
              else if (stbi__unpremultiply_on_load == 0) {
                for (lVar18 = 0; iVar9 != (int)lVar18; lVar18 = lVar18 + 1) {
                  sVar8 = psVar15[lVar18 * 4];
                  psVar15[lVar18 * 4] = psVar15[lVar18 * 4 + 2];
                  psVar15[lVar18 * 4 + 2] = sVar8;
                }
              }
              else {
                for (lVar18 = 0; iVar9 != (int)lVar18; lVar18 = lVar18 + 1) {
                  bVar6 = psVar15[lVar18 * 4 + 3];
                  bVar7 = psVar15[lVar18 * 4];
                  if (bVar6 == 0) {
                    psVar15[lVar18 * 4] = psVar15[lVar18 * 4 + 2];
                    psVar15[lVar18 * 4 + 2] = bVar7;
                  }
                  else {
                    uVar25 = (uint)(bVar6 >> 1);
                    uVar23 = (ushort)bVar6;
                    psVar15[lVar18 * 4] =
                         (stbi_uc)(((uint)psVar15[lVar18 * 4 + 2] * 0xff + uVar25 & 0xffff) /
                                  (uint)uVar23);
                    psVar15[lVar18 * 4 + 1] =
                         (stbi_uc)(((uint)psVar15[lVar18 * 4 + 1] * 0xff + uVar25 & 0xffff) /
                                  (uint)uVar23);
                    psVar15[lVar18 * 4 + 2] =
                         (stbi_uc)(((uint)bVar7 * 0xff + uVar25 & 0xffff) / (uint)uVar23);
                  }
                }
              }
            }
            if (bVar28 == 0) {
              if (bVar5) {
                s->img_n = s->img_n + 1;
              }
LAB_0015e3fc:
              free(z->expanded);
              z->expanded = (stbi_uc *)0x0;
              stbi__get32be(s);
              return 1;
            }
            s->img_n = (uint)bVar28;
            uVar25 = (uint)bVar28;
            if (2 < req_comp) {
              uVar25 = req_comp;
            }
            s->img_out_n = uVar25;
            psVar15 = z->out;
            uVar30 = z->s->img_y * z->s->img_x;
            psVar16 = (stbi_uc *)stbi__malloc_mad2(uVar30,uVar25,0);
            if (psVar16 != (stbi_uc *)0x0) {
              uVar20 = 0;
              psVar19 = psVar16;
              if (uVar25 == 3) {
                for (; uVar30 != uVar20; uVar20 = uVar20 + 1) {
                  uVar22 = (ulong)psVar15[uVar20];
                  sVar8 = palette[uVar22 * 4 + 1];
                  sVar2 = palette[uVar22 * 4 + 2];
                  *psVar19 = palette[uVar22 * 4];
                  psVar19[1] = sVar8;
                  psVar19[2] = sVar2;
                  psVar19 = psVar19 + 3;
                }
              }
              else {
                for (; uVar30 != uVar20; uVar20 = uVar20 + 1) {
                  *(undefined4 *)(psVar16 + uVar20 * 4) =
                       *(undefined4 *)(palette + (ulong)psVar15[uVar20] * 4);
                }
              }
              free(psVar15);
              z->out = psVar16;
              goto LAB_0015e3fc;
            }
LAB_0015e3b7:
            pcVar14 = "outofmem";
            goto LAB_0015dd0a;
          }
          pcVar14 = "no IDAT";
          goto LAB_0015dd0a;
        }
      }
      else if (!bVar32) {
        bVar32 = false;
        if ((sVar11 >> 0x1d & 1) == 0) {
          stbi__parse_png_file::invalid_chunk._0_4_ = swap_bytes(sVar11);
          *(char **)(in_FS_OFFSET + -0x10) = stbi__parse_png_file::invalid_chunk;
          return 0;
        }
        goto LAB_0015da27;
      }
LAB_0015dd03:
      pcVar14 = "first not IHDR";
      goto LAB_0015dd0a;
    }
    if (!bVar32) {
      pcVar14 = "multiple IHDR";
      goto LAB_0015dd0a;
    }
    if (sVar10 != 0xd) {
      pcVar14 = "bad IHDR len";
      goto LAB_0015dd0a;
    }
    sVar10 = stbi__get32be(s);
    s->img_x = sVar10;
    if (0x1000000 < sVar10) {
LAB_0015dcd6:
      pcVar14 = "too large";
LAB_0015dd0a:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
      return 0;
    }
    sVar10 = stbi__get32be(s);
    s->img_y = sVar10;
    if (0x1000000 < sVar10) goto LAB_0015dcd6;
    bVar6 = stbi__get8(s);
    z->depth = (uint)bVar6;
    if ((0x10 < bVar6) || ((0x10116U >> (bVar6 & 0x1f) & 1) == 0)) {
      pcVar14 = "1/2/4/8/16-bit only";
      goto LAB_0015dd0a;
    }
    bVar7 = stbi__get8(s);
    if (6 < bVar7) {
LAB_0015dce8:
      pcVar14 = "bad ctype";
      goto LAB_0015dd0a;
    }
    color = (uint)bVar7;
    if (bVar7 == 3) {
      bVar28 = 3;
      if (z->depth == 0x10) goto LAB_0015dce8;
    }
    else if ((bVar7 & 1) != 0) goto LAB_0015dce8;
    sVar8 = stbi__get8(s);
    if (sVar8 != '\0') {
      pcVar14 = "bad comp method";
      goto LAB_0015dd0a;
    }
    sVar8 = stbi__get8(s);
    if (sVar8 != '\0') {
      pcVar14 = "bad filter method";
      goto LAB_0015dd0a;
    }
    bVar6 = stbi__get8(s);
    if (1 < bVar6) {
      pcVar14 = "bad interlace method";
      goto LAB_0015dd0a;
    }
    uVar26 = s->img_x;
    if ((uVar26 == 0) || (uVar17 = s->img_y, uVar17 == 0)) {
      pcVar14 = "0-pixel image";
      goto LAB_0015dd0a;
    }
    if (bVar28 == 0) {
      uVar21 = (3 < bVar7) + 1 + (bVar7 & 2);
      s->img_n = uVar21;
      if ((uint)((0x40000000 / (ulong)uVar26) / (ulong)uVar21) < uVar17) goto LAB_0015dcd6;
      bVar32 = false;
      bVar28 = 0;
      if (scan == 2) {
        return 1;
      }
    }
    else {
      s->img_n = 1;
      bVar32 = false;
      if ((uint)(0x40000000 / (ulong)uVar26 >> 2) < uVar17) goto LAB_0015dcd6;
    }
  }
LAB_0015dcc9:
  stbi__get32be(s);
  goto LAB_0015d8b9;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}